

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void lm_trie_fill_raw_ngram
               (lm_trie_t *trie,ngram_raw_t *raw_ngrams,uint32 *raw_ngram_idx,uint32 *counts,
               node_range_t range,uint32 *hist,int n_hist,int order,int max_order)

{
  uint8 *puVar1;
  longest_t *plVar2;
  node_range_t range_00;
  int iVar3;
  uint32 uVar4;
  uint32 uVar5;
  middle_t *pmVar6;
  ngram_raw_t *pnVar7;
  uint32 *puVar8;
  float fVar9;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  bitarr_address_t address_02;
  bitarr_address_t address_03;
  bitarr_address_t address_04;
  bitarr_address_t address_05;
  bitarr_address_t address_06;
  bitarr_address_t address_07;
  middle_t *middle_1;
  longest_t *longest;
  ngram_raw_t *raw_ngram;
  int i_1;
  float backoff;
  float prob;
  uint32 ptr_1;
  bitarr_address_t address_1;
  middle_t *middle;
  uint32 new_word;
  bitarr_address_t address;
  node_range_t node_1;
  uint32 ptr;
  node_range_t node;
  uint32 i;
  uint32 *hist_local;
  uint32 *counts_local;
  uint32 *raw_ngram_idx_local;
  ngram_raw_t *raw_ngrams_local;
  lm_trie_t *trie_local;
  node_range_t range_local;
  
  trie_local._0_4_ = (float)range.begin;
  trie_local._4_4_ = (float)range.end;
  if ((n_hist < 1) || (trie_local._0_4_ != trie_local._4_4_)) {
    if (n_hist == 0) {
      for (node.begin = 0; node.begin < *counts; node.begin = node.begin + 1) {
        unigram_find(trie->unigrams,node.begin,(node_range_t *)&node_1.end);
        *hist = node.begin;
        lm_trie_fill_raw_ngram
                  (trie,raw_ngrams,raw_ngram_idx,counts,stack0xffffffffffffffbc,hist,1,order,
                   max_order);
      }
    }
    else if (n_hist < order + -1) {
      pmVar6 = trie->middle_begin + (n_hist + -1);
      for (node_1.begin = (uint32)trie_local._0_4_; node_1.begin < (uint)trie_local._4_4_;
          node_1.begin = node_1.begin + 1) {
        puVar1 = (pmVar6->base).base;
        iVar3 = node_1.begin * (pmVar6->base).total_bits;
        address_00.offset = iVar3;
        address_00.base = puVar1;
        address_00._12_4_ = 0;
        uVar4 = bitarr_read_int25(address_00,(pmVar6->base).word_bits,(pmVar6->base).word_mask);
        hist[n_hist] = uVar4;
        address_01.offset = (uint)(pmVar6->base).word_bits + (uint)pmVar6->quant_bits + iVar3;
        address_01.base = puVar1;
        address_01._12_4_ = 0;
        uVar4 = bitarr_read_int25(address_01,(pmVar6->next_mask).bits,(pmVar6->next_mask).mask);
        address_02.offset =
             (node_1.begin + 1) * (uint)(pmVar6->base).total_bits + (uint)(pmVar6->base).word_bits +
             (uint)pmVar6->quant_bits;
        address_02.base = puVar1;
        address_02._12_4_ = 0;
        uVar5 = bitarr_read_int25(address_02,(pmVar6->next_mask).bits,(pmVar6->next_mask).mask);
        range_00.end = uVar5;
        range_00.begin = uVar4;
        lm_trie_fill_raw_ngram
                  (trie,raw_ngrams,raw_ngram_idx,counts,range_00,hist,n_hist + 1,order,max_order);
      }
    }
    else {
      if (n_hist != order + -1) {
        __assert_fail("n_hist == order - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x36e,
                      "void lm_trie_fill_raw_ngram(lm_trie_t *, ngram_raw_t *, uint32 *, uint32 *, node_range_t, uint32 *, int, int, int)"
                     );
      }
      for (backoff = trie_local._0_4_; (uint)backoff < (uint)trie_local._4_4_;
          backoff = (float)((int)backoff + 1)) {
        pnVar7 = raw_ngrams + *raw_ngram_idx;
        if (order == max_order) {
          plVar2 = trie->longest;
          puVar1 = (plVar2->base).base;
          iVar3 = (int)backoff * (uint)(plVar2->base).total_bits;
          address_03.offset = iVar3;
          address_03.base = puVar1;
          address_03._12_4_ = 0;
          uVar4 = bitarr_read_int25(address_03,(plVar2->base).word_bits,(plVar2->base).word_mask);
          hist[n_hist] = uVar4;
          address_05.offset = (uint)(plVar2->base).word_bits + iVar3;
          address_05.base = puVar1;
          address_05._12_4_ = 0;
          i_1 = (int)lm_trie_quant_lpread(trie->quant,address_05);
        }
        else {
          pmVar6 = trie->middle_begin + (n_hist + -1);
          puVar1 = (pmVar6->base).base;
          iVar3 = (int)backoff * (uint)(pmVar6->base).total_bits;
          address_04.offset = iVar3;
          address_04.base = puVar1;
          address_04._12_4_ = 0;
          uVar4 = bitarr_read_int25(address_04,(pmVar6->base).word_bits,(pmVar6->base).word_mask);
          hist[n_hist] = uVar4;
          iVar3 = (uint)(pmVar6->base).word_bits + iVar3;
          address_06.offset = iVar3;
          address_06.base = puVar1;
          address_06._12_4_ = 0;
          i_1 = (int)lm_trie_quant_mpread(trie->quant,address_06,n_hist + -1);
          address_07.offset = iVar3;
          address_07.base = puVar1;
          address_07._12_4_ = 0;
          fVar9 = lm_trie_quant_mboread(trie->quant,address_07,n_hist + -1);
          pnVar7->backoff = (float32)fVar9;
        }
        pnVar7->prob = (float32)i_1;
        puVar8 = (uint32 *)
                 __ckd_calloc__((long)order,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                ,0x38c);
        pnVar7->words = puVar8;
        for (raw_ngram._0_4_ = 0; (int)raw_ngram <= n_hist; raw_ngram._0_4_ = (int)raw_ngram + 1) {
          pnVar7->words[(int)raw_ngram] = hist[n_hist - (int)raw_ngram];
        }
        *raw_ngram_idx = *raw_ngram_idx + 1;
      }
    }
  }
  return;
}

Assistant:

void
lm_trie_fill_raw_ngram(lm_trie_t * trie,
    		       ngram_raw_t * raw_ngrams, uint32 * raw_ngram_idx,
            	       uint32 * counts, node_range_t range, uint32 * hist,
    	               int n_hist, int order, int max_order)
{
    if (n_hist > 0 && range.begin == range.end) {
        return;
    }
    if (n_hist == 0) {
        uint32 i;
        for (i = 0; i < counts[0]; i++) {
            node_range_t node;
            unigram_find(trie->unigrams, i, &node);
            hist[0] = i;
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, 1, order, max_order);
        }
    }
    else if (n_hist < order - 1) {
        uint32 ptr;
        node_range_t node;
        bitarr_address_t address;
        uint32 new_word;
        middle_t *middle = &trie->middle_begin[n_hist - 1];
        for (ptr = range.begin; ptr < range.end; ptr++) {
            address.base = middle->base.base;
            address.offset = ptr * middle->base.total_bits;
            new_word =
                bitarr_read_int25(address, middle->base.word_bits,
                                  middle->base.word_mask);
            hist[n_hist] = new_word;
            address.offset += middle->base.word_bits + middle->quant_bits;
            node.begin =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            address.offset =
                (ptr + 1) * middle->base.total_bits +
                middle->base.word_bits + middle->quant_bits;
            node.end =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, n_hist + 1, order, max_order);
        }
    }
    else {
        bitarr_address_t address;
        uint32 ptr;
        float prob, backoff;
        int i;
        assert(n_hist == order - 1);
        for (ptr = range.begin; ptr < range.end; ptr++) {
            ngram_raw_t *raw_ngram = &raw_ngrams[*raw_ngram_idx];
            if (order == max_order) {
                longest_t *longest = trie->longest;
                address.base = longest->base.base;
                address.offset = ptr * longest->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, longest->base.word_bits,
                                      longest->base.word_mask);
                address.offset += longest->base.word_bits;
                prob = lm_trie_quant_lpread(trie->quant, address);
            }
            else {
                middle_t *middle = &trie->middle_begin[n_hist - 1];
                address.base = middle->base.base;
                address.offset = ptr * middle->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, middle->base.word_bits,
                                      middle->base.word_mask);
                address.offset += middle->base.word_bits;
                prob =
                    lm_trie_quant_mpread(trie->quant, address, n_hist - 1);
                backoff =
                    lm_trie_quant_mboread(trie->quant, address,
                                          n_hist - 1);
                raw_ngram->backoff = backoff;
            }
            raw_ngram->prob = prob;
            raw_ngram->words =
                (uint32 *) ckd_calloc(order, sizeof(*raw_ngram->words));
            for (i = 0; i <= n_hist; i++) {
                raw_ngram->words[i] = hist[n_hist - i];
            }
            (*raw_ngram_idx)++;
        }
    }
}